

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.h
# Opt level: O1

IRBuiltinHandler * __thiscall flow::IRProgram::getBuiltinHandler(IRProgram *this,NativeCallback *cb)

{
  vector<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
  *this_00;
  bool bVar1;
  Signature *pSVar2;
  Signature *pSVar3;
  _Head_base<0UL,_flow::IRBuiltinHandler_*,_false> _Var4;
  undefined7 extraout_var_00;
  tuple<flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_> this_01;
  long lVar5;
  long lVar6;
  bool bVar7;
  __uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_> local_38;
  undefined7 extraout_var;
  
  this_00 = &this->builtinHandlers_;
  _Var4._M_head_impl =
       (IRBuiltinHandler *)
       (this->builtinHandlers_).
       super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->builtinHandlers_).
                super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)_Var4._M_head_impl;
  bVar7 = lVar6 == 0;
  if (!bVar7) {
    pSVar2 = NativeCallback::signature
                       (*(NativeCallback **)
                         ((long)(((this_00->
                                  super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>
                         + 0x48));
    pSVar3 = NativeCallback::signature(cb);
    _Var4._M_head_impl._0_1_ = Signature::operator==(pSVar2,pSVar3);
    _Var4._M_head_impl._1_7_ = extraout_var;
    if (_Var4._M_head_impl._0_1_) {
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      do {
        bVar7 = (lVar6 >> 3) + -1 == lVar5;
        if (bVar7) goto LAB_0011464c;
        pSVar2 = NativeCallback::signature
                           (*(NativeCallback **)
                             ((long)(this_00->
                                    super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[lVar5 + 1]._M_t.
                                    super___uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>
                             + 0x48));
        pSVar3 = NativeCallback::signature(cb);
        bVar1 = Signature::operator==(pSVar2,pSVar3);
        _Var4._M_head_impl = (IRBuiltinHandler *)CONCAT71(extraout_var_00,bVar1);
        lVar5 = lVar5 + 1;
      } while (!bVar1);
    }
    _Var4._M_head_impl =
         *(IRBuiltinHandler **)
          &(this_00->
           super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
           super___uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>
    ;
  }
LAB_0011464c:
  if (bVar7) {
    this_01.
    super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>.
    super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>)
         operator_new(0x50);
    pSVar2 = NativeCallback::signature(cb);
    Value::Value((Value *)this_01.
                          super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
                          .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl,
                 Boolean,&pSVar2->name_);
    *(undefined ***)
     this_01.
     super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>.
     super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl = &PTR__Value_00194400;
    ((Value *)
    ((long)this_01.
           super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
           .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl + 0x48))->
    _vptr_Value = (_func_int **)cb;
    local_38._M_t.
    super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>.
    super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl =
         (tuple<flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>)
         (tuple<flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>)
         this_01.
         super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
         .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>,std::allocator<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>>>
    ::
    emplace_back<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>>
              ((vector<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>,std::allocator<std::unique_ptr<flow::IRBuiltinHandler,std::default_delete<flow::IRBuiltinHandler>>>>
                *)this_00,
               (unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_> *)
               &local_38);
    if ((_Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>)
        local_38._M_t.
        super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
        .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl !=
        (IRBuiltinHandler *)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
                            .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl + 8
                  ))();
    }
    _Var4._M_head_impl =
         (this->builtinHandlers_).
         super__Vector_base<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::IRBuiltinHandler,_std::default_delete<flow::IRBuiltinHandler>_>
         ._M_t.
         super__Tuple_impl<0UL,_flow::IRBuiltinHandler_*,_std::default_delete<flow::IRBuiltinHandler>_>
         .super__Head_base<0UL,_flow::IRBuiltinHandler_*,_false>._M_head_impl;
  }
  return _Var4._M_head_impl;
}

Assistant:

IRBuiltinHandler* getBuiltinHandler(const NativeCallback& cb) {
    for (size_t i = 0, e = builtinHandlers_.size(); i != e; ++i)
      if (builtinHandlers_[i]->signature() == cb.signature())
        return builtinHandlers_[i].get();

    builtinHandlers_.emplace_back(std::make_unique<IRBuiltinHandler>(cb));
    return builtinHandlers_.back().get();
  }